

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopAddVirtual(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  byte bVar1;
  Parse *pPVar2;
  SrcList *pSVar3;
  ExprList *pEVar4;
  Bitmask BVar5;
  uint uVar6;
  u16 *puVar7;
  sqlite3_index_info *pIdxInfo;
  ulong uVar8;
  ushort uVar9;
  int iVar10;
  ulong uVar11;
  u8 uVar12;
  ulong uVar13;
  ushort uVar14;
  int iVar15;
  uint uVar16;
  ExprList_item *pEVar17;
  ulong uVar18;
  int *piVar19;
  ulong uVar20;
  WhereClause *pWVar21;
  ulong uVar22;
  long lVar23;
  Bitmask mNext;
  WhereTerm *pWVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  bool bVar28;
  uint local_98;
  int bIn;
  ulong local_90;
  undefined8 local_88;
  int local_7c;
  sqlite3_index_info *local_78;
  Bitmask local_70;
  ulong local_68;
  WhereLoopBuilder *local_60;
  WhereLoop *local_58;
  WhereClause *local_50;
  long local_48;
  int *local_40;
  Parse *local_38;
  
  local_50 = pBuilder->pWC;
  pPVar2 = pBuilder->pWInfo->pParse;
  pSVar3 = pBuilder->pWInfo->pTabList;
  local_58 = pBuilder->pNew;
  bVar1 = local_58->iTab;
  pEVar4 = pBuilder->pOrderBy;
  iVar15 = 0;
  iVar10 = local_50->nTerm;
  if (local_50->nTerm < 1) {
    iVar10 = iVar15;
  }
  puVar7 = &local_50->a->wtFlags;
  while (bVar28 = iVar10 != 0, iVar10 = iVar10 + -1, bVar28) {
    if (((*(int *)(puVar7 + 5) == pSVar3->a[bVar1].iCursor) &&
        ((*(ulong *)(puVar7 + 0xf) & mUnusable) == 0)) && ((puVar7[1] & 0xf7ff) != 0)) {
      iVar15 = iVar15 + (uint)((*puVar7 & 0x80) == 0);
    }
    puVar7 = puVar7 + 0x20;
  }
  if (pEVar4 == (ExprList *)0x0) {
    local_68 = 0;
  }
  else {
    uVar16 = pEVar4->nExpr;
    pEVar17 = pEVar4->a;
    uVar22 = 0;
    uVar11 = 0;
    if (0 < (int)uVar16) {
      uVar11 = (ulong)uVar16;
    }
    for (; uVar11 != uVar22; uVar22 = uVar22 + 1) {
      if ((pEVar17->pExpr->op != 0xa2) || (pEVar17->pExpr->iTable != pSVar3->a[bVar1].iCursor)) {
        uVar11 = uVar22 & 0xffffffff;
        break;
      }
      pEVar17 = pEVar17 + 1;
    }
    local_68 = 0;
    if ((uint)uVar11 == uVar16) {
      local_68 = (ulong)uVar16;
    }
  }
  lVar27 = (long)iVar15;
  iVar10 = (int)local_68;
  local_90 = mUnusable;
  local_70 = mPrereq;
  local_60 = pBuilder;
  pIdxInfo = (sqlite3_index_info *)
             sqlite3DbMallocZero(pPVar2->db,lVar27 * 0x14 + (long)iVar10 * 8 + 0x70);
  if (pIdxInfo == (sqlite3_index_info *)0x0) {
    sqlite3ErrorMsg(pPVar2,"out of memory");
  }
  else {
    piVar19 = &pIdxInfo[1].nOrderBy;
    lVar23 = lVar27 * 0xc;
    pIdxInfo->nConstraint = iVar15;
    pIdxInfo->nOrderBy = iVar10;
    pIdxInfo->aConstraint = (sqlite3_index_constraint *)piVar19;
    pIdxInfo->aOrderBy = (sqlite3_index_orderby *)(&pIdxInfo[1].nOrderBy + lVar27 * 3);
    pIdxInfo->aConstraintUsage =
         (sqlite3_index_constraint_usage *)
         ((sqlite3_index_orderby *)(&pIdxInfo[1].nOrderBy + lVar27 * 3) + iVar10);
    *(WhereClause **)(pIdxInfo + 1) = local_50;
    pIdxInfo[1].aConstraint = (sqlite3_index_constraint *)pPVar2;
    pWVar24 = local_50->a;
    uVar16 = local_50->nTerm;
    if ((int)uVar16 < 1) {
      uVar16 = 0;
    }
    local_98 = 0;
    iVar10 = 0;
    uVar11 = local_90;
    uVar22 = local_68;
    local_38 = pPVar2;
    for (uVar26 = 0; pPVar2 = local_38, uVar16 != uVar26; uVar26 = uVar26 + 1) {
      if ((((pWVar24->leftCursor == pSVar3->a[bVar1].iCursor) &&
           ((pWVar24->prereqRight & uVar11) == 0)) &&
          ((uVar14 = pWVar24->eOperator, (uVar14 & 0xf7ff) != 0 && ((pWVar24->wtFlags & 0x80) == 0))
          )) && ((((pSVar3->a[bVar1].fg.jointype & 8) == 0 || ((uVar14 & 0x180) == 0)) ||
                 ((pWVar24->pExpr->flags & 1) != 0)))) {
        lVar27 = (long)iVar10;
        local_88 = piVar19 + lVar27 * 3;
        piVar19[lVar27 * 3] = (pWVar24->u).leftColumn;
        piVar19[lVar27 * 3 + 2] = uVar26;
        uVar14 = uVar14 & 0x1fff;
        uVar9 = uVar14;
        if (uVar14 == 1) {
          uVar9 = 2;
        }
        if (uVar9 == 0x40) {
          uVar12 = pWVar24->eMatchOp;
LAB_001762df:
          *(u8 *)(local_88 + 1) = uVar12;
        }
        else {
          if ((uVar9 & 0x180) != 0) {
            uVar12 = 'H' - (uVar9 == 0x100);
            goto LAB_001762df;
          }
          *(char *)(local_88 + 1) = (char)uVar9;
          if (((uVar9 & 0x3c) != 0) &&
             (local_7c = iVar10, local_78 = pIdxInfo, local_48 = lVar23, local_40 = piVar19,
             iVar15 = sqlite3ExprIsVector(pWVar24->pExpr->pRight), pIdxInfo = local_78,
             uVar11 = local_90, piVar19 = local_40, uVar22 = local_68, lVar23 = local_48,
             iVar10 = local_7c, iVar15 != 0)) {
            uVar6 = 1 << ((byte)uVar26 & 0x1f);
            if (0xf < uVar26) {
              uVar6 = 0;
            }
            local_98 = local_98 | uVar6;
            if (uVar14 == 0x10) {
              uVar12 = '\b';
            }
            else {
              if (uVar14 != 4) goto LAB_001762e7;
              uVar12 = ' ';
            }
            goto LAB_001762df;
          }
        }
LAB_001762e7:
        iVar10 = iVar10 + 1;
      }
      pWVar24 = pWVar24 + 1;
    }
    uVar20 = 0;
    uVar11 = uVar22 & 0xffffffff;
    if ((int)uVar22 < 1) {
      uVar11 = uVar20;
    }
    for (; uVar11 * 8 != uVar20; uVar20 = uVar20 + 8) {
      *(int *)((long)&pIdxInfo[1].nOrderBy + uVar20 + lVar23) =
           (int)*(short *)(*(long *)((long)&pEVar4->a[0].pExpr + uVar20 * 4) + 0x30);
      (&pIdxInfo[1].field_0x14)[uVar20 + lVar23] = (&pEVar4->a[0].sortOrder)[uVar20 * 4];
    }
    local_58->rSetup = 0;
    local_58->wsFlags = 0x400;
    local_58->nLTerm = 0;
    (local_58->u).vtab.needFree = '\0';
    uVar16 = pIdxInfo->nConstraint;
    iVar10 = whereLoopResize(local_38->db,local_58,uVar16);
    if (iVar10 == 0) {
      local_88 = (int *)(CONCAT44(local_88._4_4_,local_98) & 0xffffffff0000ffff);
      iVar10 = whereLoopAddVirtualOne
                         (local_60,local_70,0xffffffffffffffff,0,pIdxInfo,(u16)local_98,&bIn);
      if (iVar10 == 0) {
        uVar22 = ~local_70;
        uVar11 = local_58->prereq & uVar22;
        iVar10 = 0;
        if (bIn != 0 || uVar11 != 0) {
          if (bIn == 0) {
            iVar10 = 0;
            bVar28 = false;
            local_90 = 0;
          }
          else {
            iVar10 = whereLoopAddVirtualOne
                               (local_60,local_70,0xffffffffffffffff,1,pIdxInfo,(u16)local_88,&bIn);
            local_90 = local_58->prereq & uVar22;
            bVar28 = local_90 == 0;
          }
          uVar20 = (ulong)uVar16;
          if ((int)uVar16 < 1) {
            uVar20 = 0;
          }
          local_78 = (sqlite3_index_info *)CONCAT44(local_78._4_4_,(uint)!bVar28);
          uVar8 = 0;
          pWVar21 = local_50;
          local_68 = uVar11;
          while (BVar5 = local_70, iVar10 == 0) {
            uVar25 = 0xffffffffffffffff;
            for (lVar27 = 0; uVar20 * 0xc - lVar27 != 0; lVar27 = lVar27 + 0xc) {
              uVar13 = pWVar21->a[*(int *)((long)&pIdxInfo->aConstraint->iTermOffset + lVar27)].
                       prereqRight & uVar22;
              uVar18 = uVar25;
              if (uVar13 < uVar25) {
                uVar18 = uVar13;
              }
              if (uVar8 < uVar13) {
                uVar25 = uVar18;
              }
            }
            iVar10 = 0;
            if (uVar25 == 0xffffffffffffffff) {
              if ((((ulong)local_78 & 1) != 0) &&
                 (iVar10 = whereLoopAddVirtualOne
                                     (local_60,local_70,local_70,0,pIdxInfo,(u16)local_88,&bIn),
                 bIn == 0)) {
                bVar28 = true;
              }
              if (!bVar28 && iVar10 == 0) {
                iVar10 = whereLoopAddVirtualOne
                                   (local_60,local_70,local_70,1,pIdxInfo,(u16)local_88,&bIn);
              }
              break;
            }
            uVar8 = uVar25;
            if (((uVar25 != uVar11) && (uVar25 != local_90)) &&
               (iVar10 = whereLoopAddVirtualOne
                                   (local_60,local_70,uVar25 | local_70,0,pIdxInfo,(u16)local_88,
                                    &bIn), pWVar21 = local_50, uVar11 = local_68,
               local_58->prereq == BVar5)) {
              if (bIn == 0) {
                bVar28 = true;
              }
              local_78 = (sqlite3_index_info *)((ulong)local_78 & 0xffffffff00000000);
            }
          }
        }
      }
      if (pIdxInfo->needToFreeIdxStr != 0) {
        sqlite3_free(pIdxInfo->idxStr);
      }
      sqlite3DbFreeNN(local_38->db,pIdxInfo);
      return iVar10;
    }
    sqlite3DbFreeNN(pPVar2->db,pIdxInfo);
  }
  return 7;
}

Assistant:

static int whereLoopAddVirtual(
  WhereLoopBuilder *pBuilder,  /* WHERE clause information */
  Bitmask mPrereq,             /* Tables that must be scanned before this one */
  Bitmask mUnusable            /* Tables that must be scanned after this one */
){
  int rc = SQLITE_OK;          /* Return code */
  WhereInfo *pWInfo;           /* WHERE analysis context */
  Parse *pParse;               /* The parsing context */
  WhereClause *pWC;            /* The WHERE clause */
  struct SrcList_item *pSrc;   /* The FROM clause term to search */
  sqlite3_index_info *p;       /* Object to pass to xBestIndex() */
  int nConstraint;             /* Number of constraints in p */
  int bIn;                     /* True if plan uses IN(...) operator */
  WhereLoop *pNew;
  Bitmask mBest;               /* Tables used by best possible plan */
  u16 mNoOmit;

  assert( (mPrereq & mUnusable)==0 );
  pWInfo = pBuilder->pWInfo;
  pParse = pWInfo->pParse;
  pWC = pBuilder->pWC;
  pNew = pBuilder->pNew;
  pSrc = &pWInfo->pTabList->a[pNew->iTab];
  assert( IsVirtual(pSrc->pTab) );
  p = allocateIndexInfo(pParse, pWC, mUnusable, pSrc, pBuilder->pOrderBy, 
      &mNoOmit);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  pNew->rSetup = 0;
  pNew->wsFlags = WHERE_VIRTUALTABLE;
  pNew->nLTerm = 0;
  pNew->u.vtab.needFree = 0;
  nConstraint = p->nConstraint;
  if( whereLoopResize(pParse->db, pNew, nConstraint) ){
    sqlite3DbFree(pParse->db, p);
    return SQLITE_NOMEM_BKPT;
  }

  /* First call xBestIndex() with all constraints usable. */
  WHERETRACE(0x800, ("BEGIN %s.addVirtual()\n", pSrc->pTab->zName));
  WHERETRACE(0x40, ("  VirtualOne: all usable\n"));
  rc = whereLoopAddVirtualOne(pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn);

  /* If the call to xBestIndex() with all terms enabled produced a plan
  ** that does not require any source tables (IOW: a plan with mBest==0)
  ** and does not use an IN(...) operator, then there is no point in making 
  ** any further calls to xBestIndex() since they will all return the same
  ** result (if the xBestIndex() implementation is sane). */
  if( rc==SQLITE_OK && ((mBest = (pNew->prereq & ~mPrereq))!=0 || bIn) ){
    int seenZero = 0;             /* True if a plan with no prereqs seen */
    int seenZeroNoIN = 0;         /* Plan with no prereqs and no IN(...) seen */
    Bitmask mPrev = 0;
    Bitmask mBestNoIn = 0;

    /* If the plan produced by the earlier call uses an IN(...) term, call
    ** xBestIndex again, this time with IN(...) terms disabled. */
    if( bIn ){
      WHERETRACE(0x40, ("  VirtualOne: all usable w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, ALLBITS, WO_IN, p, mNoOmit, &bIn);
      assert( bIn==0 );
      mBestNoIn = pNew->prereq & ~mPrereq;
      if( mBestNoIn==0 ){
        seenZero = 1;
        seenZeroNoIN = 1;
      }
    }

    /* Call xBestIndex once for each distinct value of (prereqRight & ~mPrereq) 
    ** in the set of terms that apply to the current virtual table.  */
    while( rc==SQLITE_OK ){
      int i;
      Bitmask mNext = ALLBITS;
      assert( mNext>0 );
      for(i=0; i<nConstraint; i++){
        Bitmask mThis = (
            pWC->a[p->aConstraint[i].iTermOffset].prereqRight & ~mPrereq
        );
        if( mThis>mPrev && mThis<mNext ) mNext = mThis;
      }
      mPrev = mNext;
      if( mNext==ALLBITS ) break;
      if( mNext==mBest || mNext==mBestNoIn ) continue;
      WHERETRACE(0x40, ("  VirtualOne: mPrev=%04llx mNext=%04llx\n",
                       (sqlite3_uint64)mPrev, (sqlite3_uint64)mNext));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mNext|mPrereq, 0, p, mNoOmit, &bIn);
      if( pNew->prereq==mPrereq ){
        seenZero = 1;
        if( bIn==0 ) seenZeroNoIN = 1;
      }
    }

    /* If the calls to xBestIndex() in the above loop did not find a plan
    ** that requires no source tables at all (i.e. one guaranteed to be
    ** usable), make a call here with all source tables disabled */
    if( rc==SQLITE_OK && seenZero==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, 0, p, mNoOmit, &bIn);
      if( bIn==0 ) seenZeroNoIN = 1;
    }

    /* If the calls to xBestIndex() have so far failed to find a plan
    ** that requires no source tables at all and does not use an IN(...)
    ** operator, make a final call to obtain one here.  */
    if( rc==SQLITE_OK && seenZeroNoIN==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled and w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, WO_IN, p, mNoOmit, &bIn);
    }
  }

  if( p->needToFreeIdxStr ) sqlite3_free(p->idxStr);
  sqlite3DbFreeNN(pParse->db, p);
  WHERETRACE(0x800, ("END %s.addVirtual(), rc=%d\n", pSrc->pTab->zName, rc));
  return rc;
}